

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O2

cmCPackComponent * __thiscall
cmCPackGenerator::GetComponent(cmCPackGenerator *this,string *projectName,string *name)

{
  mapped_type *pmVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  char *pcVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  _Alloc_hider _Var6;
  cmCPackComponent *component;
  cmCPackComponent *child;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  installTypesVector;
  string macroPrefix;
  allocator local_a1;
  mapped_type *local_a0;
  string local_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  sVar4 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
          ::count(&this->Components,name);
  local_a0 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
             ::operator[](&this->Components,name);
  if (sVar4 == 0) {
    cmsys::SystemTools::UpperCase(&local_98,name);
    std::operator+(&local_50,"CPACK_COMPONENT_",&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::_M_assign((string *)local_a0);
    std::operator+(&local_98,&local_50,"_DISPLAY_NAME");
    pcVar5 = GetOption(this,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    if ((pcVar5 == (char *)0x0) || (*pcVar5 == '\0')) {
      std::__cxx11::string::_M_assign((string *)&local_a0->DisplayName);
    }
    else {
      std::__cxx11::string::assign((char *)&local_a0->DisplayName);
    }
    std::operator+(&local_98,&local_50,"_HIDDEN");
    bVar2 = IsOn(this,&local_98);
    local_a0->field_0x48 = local_a0->field_0x48 & 0xfd | bVar2 * '\x02';
    std::__cxx11::string::~string((string *)&local_98);
    std::operator+(&local_98,&local_50,"_REQUIRED");
    bVar2 = IsOn(this,&local_98);
    local_a0->field_0x48 = local_a0->field_0x48 & 0xfe | bVar2;
    std::__cxx11::string::~string((string *)&local_98);
    std::operator+(&local_98,&local_50,"_DISABLED");
    bVar2 = IsOn(this,&local_98);
    local_a0->field_0x48 = local_a0->field_0x48 & 0xfb | bVar2 << 2;
    std::__cxx11::string::~string((string *)&local_98);
    std::operator+(&local_98,&local_50,"_DOWNLOADED");
    bVar2 = IsOn(this,&local_98);
    if (bVar2) {
      local_a0->field_0x48 = local_a0->field_0x48 | 8;
    }
    else {
      std::__cxx11::string::string((string *)&local_78,"CPACK_DOWNLOAD_ALL",&local_a1);
      pcVar5 = GetOption(this,&local_78);
      bVar2 = cmSystemTools::IsOn(pcVar5);
      local_a0->field_0x48 = local_a0->field_0x48 & 0xf7 | bVar2 << 3;
      std::__cxx11::string::~string((string *)&local_78);
    }
    std::__cxx11::string::~string((string *)&local_98);
    std::operator+(&local_98,&local_50,"_ARCHIVE_FILE");
    pcVar5 = GetOption(this,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
      std::__cxx11::string::assign((char *)&local_a0->ArchiveFile);
    }
    std::operator+(&local_98,&local_50,"_GROUP");
    pcVar5 = GetOption(this,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    if ((pcVar5 == (char *)0x0) || (*pcVar5 == '\0')) {
      local_a0->Group = (cmCPackComponentGroup *)0x0;
    }
    else {
      std::__cxx11::string::string((string *)&local_98,pcVar5,(allocator *)&local_78);
      iVar3 = (*(this->super_cmObject)._vptr_cmObject[0x1b])(this,projectName,&local_98);
      local_a0->Group = (cmCPackComponentGroup *)CONCAT44(extraout_var,iVar3);
      std::__cxx11::string::~string((string *)&local_98);
      std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::push_back
                (&local_a0->Group->Components,&local_a0);
    }
    std::operator+(&local_98,&local_50,"_DESCRIPTION");
    pcVar5 = GetOption(this,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
      std::__cxx11::string::assign((char *)&local_a0->Description);
    }
    std::operator+(&local_98,&local_50,"_INSTALL_TYPES");
    pcVar5 = GetOption(this,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
      local_78._M_dataplus._M_p = (pointer)0x0;
      local_78._M_string_length = 0;
      local_78.field_2._M_allocated_capacity = 0;
      std::__cxx11::string::string((string *)&local_98,pcVar5,&local_a1);
      cmSystemTools::ExpandListArgument
                (&local_98,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_78,false);
      std::__cxx11::string::~string((string *)&local_98);
      for (_Var6._M_p = local_78._M_dataplus._M_p; pmVar1 = local_a0,
          _Var6._M_p != (pointer)local_78._M_string_length; _Var6._M_p = _Var6._M_p + 0x20) {
        iVar3 = (*(this->super_cmObject)._vptr_cmObject[0x19])(this,projectName,_Var6._M_p);
        local_98._M_dataplus._M_p = (pointer)CONCAT44(extraout_var_00,iVar3);
        std::vector<cmCPackInstallationType*,std::allocator<cmCPackInstallationType*>>::
        emplace_back<cmCPackInstallationType*>
                  ((vector<cmCPackInstallationType*,std::allocator<cmCPackInstallationType*>> *)
                   &pmVar1->InstallationTypes,(cmCPackInstallationType **)&local_98);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_78);
    }
    std::operator+(&local_98,&local_50,"_DEPENDS");
    pcVar5 = GetOption(this,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
      local_78._M_dataplus._M_p = (pointer)0x0;
      local_78._M_string_length = 0;
      local_78.field_2._M_allocated_capacity = 0;
      std::__cxx11::string::string((string *)&local_98,pcVar5,&local_a1);
      cmSystemTools::ExpandListArgument
                (&local_98,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_78,false);
      std::__cxx11::string::~string((string *)&local_98);
      for (_Var6._M_p = local_78._M_dataplus._M_p; _Var6._M_p != (pointer)local_78._M_string_length;
          _Var6._M_p = _Var6._M_p + 0x20) {
        iVar3 = (*(this->super_cmObject)._vptr_cmObject[0x1a])(this,projectName,_Var6._M_p);
        local_98._M_dataplus._M_p = (pointer)CONCAT44(extraout_var_01,iVar3);
        std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::push_back
                  (&local_a0->Dependencies,(value_type *)&local_98);
        std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::push_back
                  ((vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_> *)
                   (local_98._M_dataplus._M_p + 0xc0),&local_a0);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_78);
    }
    std::__cxx11::string::~string((string *)&local_50);
  }
  return local_a0;
}

Assistant:

cmCPackComponent*
cmCPackGenerator::GetComponent(const std::string& projectName,
                               const std::string& name)
{
  bool hasComponent = this->Components.count(name) != 0;
  cmCPackComponent *component = &this->Components[name];
  if (!hasComponent)
    {
    // Define the component
    std::string macroPrefix = "CPACK_COMPONENT_"
      + cmsys::SystemTools::UpperCase(name);
    component->Name = name;
    const char* displayName
      = this->GetOption(macroPrefix + "_DISPLAY_NAME");
    if (displayName && *displayName)
      {
      component->DisplayName = displayName;
      }
    else
      {
      component->DisplayName = component->Name;
      }
    component->IsHidden
      = this->IsOn(macroPrefix + "_HIDDEN");
    component->IsRequired
      = this->IsOn(macroPrefix + "_REQUIRED");
    component->IsDisabledByDefault
      = this->IsOn(macroPrefix + "_DISABLED");
    component->IsDownloaded
      = this->IsOn(macroPrefix + "_DOWNLOADED")
        || cmSystemTools::IsOn(this->GetOption("CPACK_DOWNLOAD_ALL"));

    const char* archiveFile = this->GetOption(macroPrefix +
                                               "_ARCHIVE_FILE");
    if (archiveFile && *archiveFile)
      {
      component->ArchiveFile = archiveFile;
      }

    const char* groupName = this->GetOption(macroPrefix + "_GROUP");
    if (groupName && *groupName)
      {
      component->Group = GetComponentGroup(projectName, groupName);
      component->Group->Components.push_back(component);
      }
    else
      {
      component->Group = 0;
      }

    const char* description
      = this->GetOption(macroPrefix + "_DESCRIPTION");
    if (description && *description)
      {
      component->Description = description;
      }

    // Determine the installation types.
    const char *installTypes
      = this->GetOption(macroPrefix + "_INSTALL_TYPES");
    if (installTypes && *installTypes)
      {
      std::vector<std::string> installTypesVector;
      cmSystemTools::ExpandListArgument(installTypes, installTypesVector);
      std::vector<std::string>::iterator installTypesIt;
      for (installTypesIt = installTypesVector.begin();
           installTypesIt != installTypesVector.end();
           ++installTypesIt)
        {
        component->InstallationTypes.push_back(
          this->GetInstallationType(projectName, *installTypesIt));
        }
      }

    // Determine the component dependencies.
    const char *depends = this->GetOption(macroPrefix + "_DEPENDS");
    if (depends && *depends)
      {
      std::vector<std::string> dependsVector;
      cmSystemTools::ExpandListArgument(depends, dependsVector);
      std::vector<std::string>::iterator dependIt;
      for (dependIt = dependsVector.begin();
           dependIt != dependsVector.end();
           ++dependIt)
        {
        cmCPackComponent *child = GetComponent(projectName,
                                               *dependIt);
        component->Dependencies.push_back(child);
        child->ReverseDependencies.push_back(component);
        }
      }
    }
  return component;
}